

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

bool __thiscall kj::Path::isNetbiosName(Path *this,ArrayPtr<const_char> part)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar3 = part.ptr;
  pcVar2 = (char *)0x0;
  while (pcVar3 != pcVar2) {
    bVar1 = pcVar2[(long)&this->parts];
    pcVar2 = pcVar2 + 1;
    if ((((byte)(bVar1 - 0x3a) < 0xf6) && ((byte)(bVar1 - 0x2f) < 0xfe)) &&
       ((byte)((bVar1 & 0xdf) + 0xa5) < 0xe6)) {
      return false;
    }
  }
  if (pcVar3 == (char *)0x0) {
    return false;
  }
  if ((byte)(*(char *)&(this->parts).ptr - 0x2dU) < 2) {
    return false;
  }
  return (byte)(((undefined1 *)((long)&this[-1].parts.disposer + 7))[(long)pcVar3] - 0x2f) < 0xfe;
}

Assistant:

bool Path::isNetbiosName(ArrayPtr<const char> part) {
  // Characters must be alphanumeric or '.' or '-'.
  for (char c: part) {
    if (c != '.' && c != '-' &&
        (c < 'a' || 'z' < c) &&
        (c < 'A' || 'Z' < c) &&
        (c < '0' || '9' < c)) {
      return false;
    }
  }

  // Can't be empty nor start or end with a '.' or a '-'.
  return part.size() > 0 &&
      part[0] != '.' && part[0] != '-' &&
      part[part.size() - 1] != '.' && part[part.size() - 1] != '-';
}